

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

bool __thiscall
gl4cts::GPUShaderFP64Test1::verifyErrorGenerationWhenCallingMismatchedDoubleUniformFunctions
          (GPUShaderFP64Test1 *this)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestError *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar4;
  char *local_2a0;
  char *local_298;
  MessageBuilder local_290;
  _uniform_function local_fc;
  _uniform_function local_f8;
  _uniform_function e_function;
  int function;
  GLint uniform_location;
  uint n_uniform_location;
  uint n_double_uniform_locations;
  GLint double_uniform_locations [13];
  bool local_a9;
  bool result;
  Functions *gl;
  undefined8 uStack_98;
  GLenum error_code;
  double double_data [16];
  GPUShaderFP64Test1 *this_local;
  long lVar3;
  
  memcpy(&stack0xffffffffffffff68,&DAT_029fd220,0x80);
  gl._4_4_ = 0;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  local_a9 = true;
  n_uniform_location = this->m_po_dmat2_uniform_location;
  n_double_uniform_locations = this->m_po_dmat2x3_uniform_location;
  double_uniform_locations[0] = this->m_po_dmat2x4_uniform_location;
  double_uniform_locations[1] = this->m_po_dmat3_uniform_location;
  double_uniform_locations[2] = this->m_po_dmat3x2_uniform_location;
  double_uniform_locations[3] = this->m_po_dmat3x4_uniform_location;
  double_uniform_locations[4] = this->m_po_dmat4_uniform_location;
  double_uniform_locations[5] = this->m_po_dmat4x2_uniform_location;
  double_uniform_locations[6] = this->m_po_dmat4x3_uniform_location;
  double_uniform_locations[7] = this->m_po_double_uniform_location;
  double_uniform_locations[8] = this->m_po_dvec2_uniform_location;
  double_uniform_locations[9] = this->m_po_dvec3_uniform_location;
  double_uniform_locations[10] = this->m_po_dvec4_uniform_location;
  uniform_location = 0xd;
  (**(code **)(lVar3 + 0x1680))(this->m_po_id);
  err = (**(code **)(lVar3 + 0x800))();
  glu::checkError(err,"glUseProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0xb03);
  for (function = 0; (uint)function < 0xd; function = function + 1) {
    e_function = (&n_uniform_location)[(uint)function];
    for (local_f8 = UNIFORM_FUNCTION_1D; (int)local_f8 < 0x11;
        local_f8 = local_f8 + UNIFORM_FUNCTION_1DV) {
      local_fc = local_f8;
      if (((((e_function != this->m_po_dmat2_uniform_location) ||
            (local_f8 != UNIFORM_FUNCTION_MATRIX2DV)) &&
           ((e_function != this->m_po_dmat2x3_uniform_location ||
            (local_f8 != UNIFORM_FUNCTION_MATRIX2X3DV)))) &&
          ((e_function != this->m_po_dmat2x4_uniform_location ||
           (local_f8 != UNIFORM_FUNCTION_MATRIX2X4DV)))) &&
         ((((((e_function != this->m_po_dmat3_uniform_location ||
              (local_f8 != UNIFORM_FUNCTION_MATRIX3DV)) &&
             ((((e_function != this->m_po_dmat3x2_uniform_location ||
                (local_f8 != UNIFORM_FUNCTION_MATRIX3X2DV)) &&
               ((e_function != this->m_po_dmat3x4_uniform_location ||
                (local_f8 != UNIFORM_FUNCTION_MATRIX3X4DV)))) &&
              ((e_function != this->m_po_dmat4_uniform_location ||
               (local_f8 != UNIFORM_FUNCTION_MATRIX4DV)))))) &&
            ((e_function != this->m_po_dmat4x2_uniform_location ||
             (local_f8 != UNIFORM_FUNCTION_MATRIX4X2DV)))) &&
           ((((e_function != this->m_po_dmat4x3_uniform_location ||
              (local_f8 != UNIFORM_FUNCTION_MATRIX4X3DV)) &&
             ((e_function != this->m_po_double_uniform_location ||
              ((local_f8 != UNIFORM_FUNCTION_1D && (local_f8 != UNIFORM_FUNCTION_1DV)))))) &&
            ((e_function != this->m_po_dvec2_uniform_location ||
             ((local_f8 != UNIFORM_FUNCTION_2D && (local_f8 != UNIFORM_FUNCTION_2DV)))))))) &&
          (((e_function != this->m_po_dvec3_uniform_location ||
            ((local_f8 != UNIFORM_FUNCTION_3D && (local_f8 != UNIFORM_FUNCTION_3DV)))) &&
           ((e_function != this->m_po_dvec4_uniform_location ||
            ((local_f8 != UNIFORM_FUNCTION_4D && (local_f8 != UNIFORM_FUNCTION_4DV)))))))))) {
        switch(local_f8) {
        case UNIFORM_FUNCTION_1D:
          (**(code **)(lVar3 + 0x14d0))(uStack_98,e_function);
          break;
        case UNIFORM_FUNCTION_1DV:
          (**(code **)(lVar3 + 0x14d8))(e_function,1,&stack0xffffffffffffff68);
          break;
        case UNIFORM_FUNCTION_2D:
          (**(code **)(lVar3 + 0x1510))(uStack_98,double_data[0],e_function);
          break;
        case UNIFORM_FUNCTION_2DV:
          (**(code **)(lVar3 + 0x1518))(e_function,1,&stack0xffffffffffffff68);
          break;
        case UNIFORM_FUNCTION_3D:
          (**(code **)(lVar3 + 0x1550))(uStack_98,double_data[0],double_data[1],e_function);
          break;
        case UNIFORM_FUNCTION_3DV:
          (**(code **)(lVar3 + 0x1558))(e_function,1,&stack0xffffffffffffff68);
          break;
        case UNIFORM_FUNCTION_4D:
          (**(code **)(lVar3 + 0x1590))
                    (uStack_98,double_data[0],double_data[1],double_data[2],e_function);
          break;
        case UNIFORM_FUNCTION_4DV:
          (**(code **)(lVar3 + 0x1598))(e_function,1,&stack0xffffffffffffff68);
          break;
        case UNIFORM_FUNCTION_MATRIX2DV:
          (**(code **)(lVar3 + 0x15d8))(e_function,1,0,&stack0xffffffffffffff68);
          break;
        case UNIFORM_FUNCTION_MATRIX2X3DV:
          (**(code **)(lVar3 + 0x15e8))(e_function,1,0,&stack0xffffffffffffff68);
          break;
        case UNIFORM_FUNCTION_MATRIX2X4DV:
          (**(code **)(lVar3 + 0x15f8))(e_function,1,0,&stack0xffffffffffffff68);
          break;
        case UNIFORM_FUNCTION_MATRIX3DV:
          (**(code **)(lVar3 + 0x1608))(e_function,1,0,&stack0xffffffffffffff68);
          break;
        case UNIFORM_FUNCTION_MATRIX3X2DV:
          (**(code **)(lVar3 + 0x1618))(e_function,1,0,&stack0xffffffffffffff68);
          break;
        case UNIFORM_FUNCTION_MATRIX3X4DV:
          (**(code **)(lVar3 + 0x1628))(e_function,1,0,&stack0xffffffffffffff68);
          break;
        case UNIFORM_FUNCTION_MATRIX4DV:
          (**(code **)(lVar3 + 0x1638))(e_function,1,0,&stack0xffffffffffffff68);
          break;
        case UNIFORM_FUNCTION_MATRIX4X2DV:
          (**(code **)(lVar3 + 0x1648))(e_function,1,0,&stack0xffffffffffffff68);
          break;
        case UNIFORM_FUNCTION_MATRIX4X3DV:
          (**(code **)(lVar3 + 0x1658))(e_function,1,0,&stack0xffffffffffffff68);
          break;
        default:
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,"Unrecognized function",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                     ,0xb6b);
          __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        gl._4_4_ = (**(code **)(lVar3 + 0x800))();
        if (gl._4_4_ != 0x502) {
          this_01 = tcu::TestContext::getLog
                              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_290,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar4 = tcu::MessageBuilder::operator<<(&local_290,(char (*) [16])"Invalid error [");
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(uint *)((long)&gl + 4));
          pMVar4 = tcu::MessageBuilder::operator<<
                             (pMVar4,(char (*) [69])
                                     "] was generated when a mismatched double-precision uniform function "
                             );
          local_298 = getUniformFunctionString(this,local_fc);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_298);
          pMVar4 = tcu::MessageBuilder::operator<<
                             (pMVar4,(char (*) [34])"() was used to configure uniform ");
          local_2a0 = getUniformNameForLocation(this,e_function);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_2a0);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2b6cb9a);
          tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_290);
          local_a9 = false;
        }
      }
    }
  }
  return local_a9;
}

Assistant:

bool GPUShaderFP64Test1::verifyErrorGenerationWhenCallingMismatchedDoubleUniformFunctions()
{
	const double		  double_data[] = { 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15, 16 };
	glw::GLenum			  error_code	= GL_NO_ERROR;
	const glw::Functions& gl			= m_context.getRenderContext().getFunctions();
	bool				  result		= true;

	const glw::GLint double_uniform_locations[] = { m_po_dmat2_uniform_location,   m_po_dmat2x3_uniform_location,
													m_po_dmat2x4_uniform_location, m_po_dmat3_uniform_location,
													m_po_dmat3x2_uniform_location, m_po_dmat3x4_uniform_location,
													m_po_dmat4_uniform_location,   m_po_dmat4x2_uniform_location,
													m_po_dmat4x3_uniform_location, m_po_double_uniform_location,
													m_po_dvec2_uniform_location,   m_po_dvec3_uniform_location,
													m_po_dvec4_uniform_location };
	const unsigned int n_double_uniform_locations =
		sizeof(double_uniform_locations) / sizeof(double_uniform_locations[0]);

	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

	for (unsigned int n_uniform_location = 0; n_uniform_location < n_double_uniform_locations; ++n_uniform_location)
	{
		glw::GLint uniform_location = double_uniform_locations[n_uniform_location];

		for (int function = static_cast<int>(UNIFORM_FUNCTION_FIRST);
			 function < static_cast<int>(UNIFORM_FUNCTION_COUNT); function++)
		{
			_uniform_function e_function = static_cast<_uniform_function>(function);
			/* Exclude valid combinations */
			if (((uniform_location == m_po_dmat2_uniform_location) && (e_function == UNIFORM_FUNCTION_MATRIX2DV)) ||
				((uniform_location == m_po_dmat2x3_uniform_location) && (e_function == UNIFORM_FUNCTION_MATRIX2X3DV)) ||
				((uniform_location == m_po_dmat2x4_uniform_location) && (e_function == UNIFORM_FUNCTION_MATRIX2X4DV)) ||
				((uniform_location == m_po_dmat3_uniform_location) && (e_function == UNIFORM_FUNCTION_MATRIX3DV)) ||
				((uniform_location == m_po_dmat3x2_uniform_location) && (e_function == UNIFORM_FUNCTION_MATRIX3X2DV)) ||
				((uniform_location == m_po_dmat3x4_uniform_location) && (e_function == UNIFORM_FUNCTION_MATRIX3X4DV)) ||
				((uniform_location == m_po_dmat4_uniform_location) && (e_function == UNIFORM_FUNCTION_MATRIX4DV)) ||
				((uniform_location == m_po_dmat4x2_uniform_location) && (e_function == UNIFORM_FUNCTION_MATRIX4X2DV)) ||
				((uniform_location == m_po_dmat4x3_uniform_location) && (e_function == UNIFORM_FUNCTION_MATRIX4X3DV)) ||
				((uniform_location == m_po_double_uniform_location) &&
				 ((e_function == UNIFORM_FUNCTION_1D) || (e_function == UNIFORM_FUNCTION_1DV))) ||
				((uniform_location == m_po_dvec2_uniform_location) &&
				 ((e_function == UNIFORM_FUNCTION_2D) || (e_function == UNIFORM_FUNCTION_2DV))) ||
				((uniform_location == m_po_dvec3_uniform_location) &&
				 ((e_function == UNIFORM_FUNCTION_3D) || (e_function == UNIFORM_FUNCTION_3DV))) ||
				((uniform_location == m_po_dvec4_uniform_location) &&
				 ((e_function == UNIFORM_FUNCTION_4D) || (e_function == UNIFORM_FUNCTION_4DV))))
			{
				continue;
			}

			switch (e_function)
			{
			case UNIFORM_FUNCTION_1D:
			{
				gl.uniform1d(uniform_location, double_data[0]);

				break;
			}

			case UNIFORM_FUNCTION_2D:
			{
				gl.uniform2d(uniform_location, double_data[0], double_data[1]);

				break;
			}

			case UNIFORM_FUNCTION_3D:
			{
				gl.uniform3d(uniform_location, double_data[0], double_data[1], double_data[2]);

				break;
			}

			case UNIFORM_FUNCTION_4D:
			{
				gl.uniform4d(uniform_location, double_data[0], double_data[1], double_data[2], double_data[3]);

				break;
			}

			case UNIFORM_FUNCTION_1DV:
				gl.uniform1dv(uniform_location, 1 /* count */, double_data);
				break;
			case UNIFORM_FUNCTION_2DV:
				gl.uniform2dv(uniform_location, 1 /* count */, double_data);
				break;
			case UNIFORM_FUNCTION_3DV:
				gl.uniform3dv(uniform_location, 1 /* count */, double_data);
				break;
			case UNIFORM_FUNCTION_4DV:
				gl.uniform4dv(uniform_location, 1 /* count */, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX2DV:
				gl.uniformMatrix2dv(uniform_location, 1 /* count */, GL_FALSE, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX2X3DV:
				gl.uniformMatrix2x3dv(uniform_location, 1 /* count */, GL_FALSE, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX2X4DV:
				gl.uniformMatrix2x4dv(uniform_location, 1 /* count */, GL_FALSE, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX3DV:
				gl.uniformMatrix3dv(uniform_location, 1 /* count */, GL_FALSE, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX3X2DV:
				gl.uniformMatrix3x2dv(uniform_location, 1 /* count */, GL_FALSE, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX3X4DV:
				gl.uniformMatrix3x4dv(uniform_location, 1 /* count */, GL_FALSE, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX4DV:
				gl.uniformMatrix4dv(uniform_location, 1 /* count */, GL_FALSE, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX4X2DV:
				gl.uniformMatrix4x2dv(uniform_location, 1 /* count */, GL_FALSE, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX4X3DV:
				gl.uniformMatrix4x3dv(uniform_location, 1 /* count */, GL_FALSE, double_data);
				break;

			default:
			{
				TCU_FAIL("Unrecognized function");
			}
			} /* switch (function) */

			/* Make sure GL_INVALID_OPERATION error was generated */
			error_code = gl.getError();

			if (error_code != GL_INVALID_OPERATION)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Invalid error [" << error_code
								   << "] was generated when a mismatched "
									  "double-precision uniform function "
								   << getUniformFunctionString(e_function) << "() was used to configure uniform "
								   << getUniformNameForLocation(uniform_location) << "." << tcu::TestLog::EndMessage;

				result = false;
			}
		} /* for (all uniform functions) */
	}	 /* for (all uniform locations) */

	return result;
}